

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O3

int kftp_get_response(knetFile *ftp)

{
  uint uVar1;
  int iVar2;
  ushort *puVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  char *pcVar7;
  ushort **ppuVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uchar c;
  char *p;
  char local_39;
  char *local_38;
  
  iVar5 = socket_wait(ftp->ctrl_fd,1);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  else {
    sVar6 = read(ftp->ctrl_fd,&local_39,1);
    iVar5 = -1;
    if (sVar6 != 0) {
      uVar11 = 0;
      do {
        iVar2 = ftp->max_response;
        pcVar7 = ftp->response;
        if (iVar2 <= (int)uVar11) {
          iVar10 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar10 = 0x100;
          }
          ftp->max_response = iVar10;
          pcVar7 = (char *)realloc(pcVar7,(long)iVar10);
          ftp->response = pcVar7;
        }
        uVar1 = uVar11 + 1;
        pcVar7[(int)uVar11] = local_39;
        uVar4 = uVar1;
        if (local_39 == '\n') {
          if (2 < (int)uVar11) {
            ppuVar8 = __ctype_b_loc();
            puVar3 = *ppuVar8;
            pcVar7 = ftp->response;
            if ((((*(byte *)((long)puVar3 + (long)*pcVar7 * 2 + 1) & 8) != 0) &&
                ((*(byte *)((long)puVar3 + (long)pcVar7[1] * 2 + 1) & 8) != 0)) &&
               ((*(byte *)((long)puVar3 + (long)pcVar7[2] * 2 + 1) & 8) != 0)) {
              uVar4 = 0;
              if (pcVar7[3] == '-') goto LAB_001109f5;
              goto LAB_00110a56;
            }
          }
          uVar4 = 0;
        }
LAB_001109f5:
        uVar11 = uVar4;
        sVar6 = read(ftp->ctrl_fd,&local_39,1);
      } while (sVar6 != 0);
      if (1 < (int)uVar11) {
        pcVar7 = ftp->response;
        uVar1 = uVar11;
LAB_00110a56:
        pcVar7[(ulong)uVar1 - 2] = '\0';
        lVar9 = strtol(ftp->response,&local_38,0);
        iVar5 = (int)lVar9;
      }
    }
  }
  return iVar5;
}

Assistant:

static int kftp_get_response(knetFile *ftp)
{
#ifndef _WIN32
	unsigned char c;
#else
	char c;
#endif
	int n = 0;
	char *p;
	if (socket_wait(ftp->ctrl_fd, 1) <= 0) return 0;
	while (netread(ftp->ctrl_fd, &c, 1)) { // FIXME: this is *VERY BAD* for unbuffered I/O
		//fputc(c, stderr);
		if (n >= ftp->max_response) {
			ftp->max_response = ftp->max_response? ftp->max_response<<1 : 256;
			ftp->response = (char*)realloc(ftp->response, ftp->max_response);
		}
		ftp->response[n++] = c;
		if (c == '\n') {
			if (n >= 4 && isdigit(ftp->response[0]) && isdigit(ftp->response[1]) && isdigit(ftp->response[2])
				&& ftp->response[3] != '-') break;
			n = 0;
			continue;
		}
	}
	if (n < 2) return -1;
	ftp->response[n-2] = 0;
	return strtol(ftp->response, &p, 0);
}